

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<double>::UnsafeArenaSwap
          (RepeatedField<double> *this,RepeatedField<double> *other)

{
  Nullable<const_char_*> failure_msg;
  Arena *local_30 [2];
  Arena *local_20;
  
  if (this != other) {
    local_30[0] = GetArena(this);
    local_20 = GetArena(other);
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                            (local_30,&local_20,"GetArena() == other->GetArena()");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                 ,0x445,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_30);
    }
    InternalSwap(this,other);
  }
  return;
}

Assistant:

void RepeatedField<Element>::UnsafeArenaSwap(RepeatedField* other) {
  if (this == other) return;
  ABSL_DCHECK_EQ(GetArena(), other->GetArena());
  InternalSwap(other);
}